

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

char * lua_tolstring(lua_State *L,int idx,size_t *len)

{
  uint64_t uVar1;
  TValue *pTVar2;
  GCstr *pGVar3;
  ulong uVar4;
  
  pTVar2 = index2adr(L,idx);
  uVar4 = pTVar2->it64 >> 0x2f;
  if (uVar4 == 0xfffffffffffffffb) {
    pGVar3 = (GCstr *)(pTVar2->it64 & 0x7fffffffffff);
  }
  else {
    if (0xfffffffffffffff2 < uVar4) {
      if (len != (size_t *)0x0) {
        *len = 0;
      }
      return (char *)0x0;
    }
    uVar1 = (L->glref).ptr64;
    if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
      lj_gc_step(L);
    }
    pTVar2 = index2adr(L,idx);
    pGVar3 = lj_strfmt_number(L,pTVar2);
    pTVar2->u64 = (ulong)pGVar3 | 0xfffd800000000000;
  }
  if (len != (size_t *)0x0) {
    *len = (ulong)pGVar3->len;
  }
  return (char *)(pGVar3 + 1);
}

Assistant:

LUA_API const char *lua_tolstring(lua_State *L, int idx, size_t *len)
{
  TValue *o = index2adr(L, idx);
  GCstr *s;
  if (LJ_LIKELY(tvisstr(o))) {
    s = strV(o);
  } else if (tvisnumber(o)) {
    lj_gc_check(L);
    o = index2adr(L, idx);  /* GC may move the stack. */
    s = lj_strfmt_number(L, o);
    setstrV(L, o, s);
  } else {
    if (len != NULL) *len = 0;
    return NULL;
  }
  if (len != NULL) *len = s->len;
  return strdata(s);
}